

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O0

void borg_cheat_inven(void)

{
  object *obj_00;
  int iVar1;
  char *pcVar2;
  object *obj;
  char buf [256];
  int local_c;
  wchar_t i;
  
  for (local_c = 0; local_c < (int)(uint)z_info->pack_size; local_c = local_c + 1) {
    obj_00 = player->upkeep->inven[local_c];
    memset(borg_items + local_c,0,0x388);
    if ((obj_00 != (object *)0x0) && (obj_00->kind != (object_kind *)0x0)) {
      obj._0_1_ = 0;
      object_desc((char *)&obj,0x100,obj_00,3,player);
      iVar1 = strcmp((char *)&obj,"(nothing)");
      if (iVar1 != 0) {
        borg_item_analyze(borg_items + local_c,obj_00,(char *)&obj,false);
        borg_do_crush_junk = true;
        pcVar2 = strstr(borg_items[local_c].desc,"!");
        if ((pcVar2 != (char *)0x0) ||
           (pcVar2 = strstr(borg_items[local_c].desc,"borg"), pcVar2 != (char *)0x0)) {
          borg_deinscribe(local_c);
        }
      }
    }
  }
  return;
}

Assistant:

void borg_cheat_inven(void)
{
    int i;

    char buf[256];

    /* Extract the inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        struct object *obj = player->upkeep->inven[i];
        memset(&borg_items[i], 0, sizeof(borg_item));

        /* Skip non-items */
        if (!obj || !obj->kind)
            continue;

        /* Default to "nothing" */
        buf[0] = '\0';

        /* Describe it */
        object_desc(buf, sizeof(buf), obj, ODESC_FULL, player);

        /* Skip Empty slots */
        if (streq(buf, "(nothing)"))
            continue;

        /* Analyze the item (no price) */
        borg_item_analyze(&borg_items[i], obj, buf, false);

        /* Note changed inventory */
        borg_do_crush_junk = true;

        /* Uninscribe items with ! or borg inscriptions */
        if (strstr(borg_items[i].desc, "!") || strstr(borg_items[i].desc, "borg"))
            borg_deinscribe(i);
    }
}